

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CurrencyPluralInfoAffixProvider::setTo
          (CurrencyPluralInfoAffixProvider *this,CurrencyPluralInfo *cpi,
          DecimalFormatProperties *properties,UErrorCode *status)

{
  char *codepageData;
  UnicodeString *src;
  UnicodeString local_3c0;
  undefined1 local_380 [8];
  UnicodeString patternString;
  char *keyword;
  undefined1 local_320 [4];
  int32_t plural;
  DecimalFormatProperties pluralProperties;
  UErrorCode *status_local;
  DecimalFormatProperties *properties_local;
  CurrencyPluralInfo *cpi_local;
  CurrencyPluralInfoAffixProvider *this_local;
  
  this->fBogus = false;
  pluralProperties._752_8_ = status;
  DecimalFormatProperties::DecimalFormatProperties((DecimalFormatProperties *)local_320,properties);
  for (keyword._4_4_ = ZERO; (int)keyword._4_4_ < 6; keyword._4_4_ = keyword._4_4_ + ONE) {
    codepageData = StandardPlural::getKeyword(keyword._4_4_);
    UnicodeString::UnicodeString((UnicodeString *)local_380);
    UnicodeString::UnicodeString(&local_3c0,codepageData);
    src = CurrencyPluralInfo::getCurrencyPluralPattern(cpi,&local_3c0,(UnicodeString *)local_380);
    UnicodeString::operator=((UnicodeString *)local_380,src);
    UnicodeString::~UnicodeString(&local_3c0);
    PatternParser::parseToExistingProperties
              ((UnicodeString *)local_380,(DecimalFormatProperties *)local_320,IGNORE_ROUNDING_NEVER
               ,(UErrorCode *)pluralProperties._752_8_);
    PropertiesAffixPatternProvider::setTo
              (this->affixesByPlural + (int)keyword._4_4_,(DecimalFormatProperties *)local_320,
               (UErrorCode *)pluralProperties._752_8_);
    UnicodeString::~UnicodeString((UnicodeString *)local_380);
  }
  DecimalFormatProperties::~DecimalFormatProperties((DecimalFormatProperties *)local_320);
  return;
}

Assistant:

void CurrencyPluralInfoAffixProvider::setTo(const CurrencyPluralInfo& cpi,
                                            const DecimalFormatProperties& properties,
                                            UErrorCode& status) {
    // We need to use a PropertiesAffixPatternProvider, not the simpler version ParsedPatternInfo,
    // because user-specified affix overrides still need to work.
    fBogus = false;
    DecimalFormatProperties pluralProperties(properties);
    for (int32_t plural = 0; plural < StandardPlural::COUNT; plural++) {
        const char* keyword = StandardPlural::getKeyword(static_cast<StandardPlural::Form>(plural));
        UnicodeString patternString;
        patternString = cpi.getCurrencyPluralPattern(keyword, patternString);
        PatternParser::parseToExistingProperties(
                patternString,
                pluralProperties,
                IGNORE_ROUNDING_NEVER,
                status);
        affixesByPlural[plural].setTo(pluralProperties, status);
    }
}